

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qinputdialog.cpp
# Opt level: O2

void QInputDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(QString_const&)>
                      ((QtMocHelpers *)_a,(void **)textValueChanged,0,0);
    if ((((!bVar1) &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(QString_const&)>
                            ((QtMocHelpers *)_a,(void **)textValueSelected,0,1), !bVar1)) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(int)>
                           ((QtMocHelpers *)_a,(void **)intValueChanged,0,2), !bVar1)) &&
       ((bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(int)>
                           ((QtMocHelpers *)_a,(void **)intValueSelected,0,3), !bVar1 &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(double)>
                           ((QtMocHelpers *)_a,(void **)doubleValueChanged,0,4), !bVar1)))) {
      QtMocHelpers::indexOfMethod<void(QInputDialog::*)(double)>
                ((QtMocHelpers *)_a,(void **)doubleValueSelected,0,5);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      textValueChanged((QInputDialog *)_o,(QString *)_a[1]);
      return;
    case 1:
      textValueSelected((QInputDialog *)_o,(QString *)_a[1]);
      return;
    case 2:
      intValueChanged((QInputDialog *)_o,*_a[1]);
      return;
    case 3:
      intValueSelected((QInputDialog *)_o,*_a[1]);
      return;
    case 4:
      doubleValueChanged((QInputDialog *)_o,*_a[1]);
      return;
    case 5:
      doubleValueSelected((QInputDialog *)_o,*_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QInputDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QInputDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textValueChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->textValueSelected((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->intValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->intValueSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->doubleValueChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 5: _t->doubleValueSelected((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(const QString & )>(_a, &QInputDialog::textValueChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(const QString & )>(_a, &QInputDialog::textValueSelected, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(int )>(_a, &QInputDialog::intValueChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(int )>(_a, &QInputDialog::intValueSelected, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(double )>(_a, &QInputDialog::doubleValueChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(double )>(_a, &QInputDialog::doubleValueSelected, 5))
            return;
    }
}